

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UDataMemory * udata_cacheDataItem(char *path,UDataMemory *item,UErrorCode *pErr)

{
  UBool UVar1;
  UDataMemory *pUVar2;
  size_t sVar3;
  void *pvVar4;
  char *local_60;
  UErrorCode local_54;
  void *pvStack_50;
  UErrorCode subErr;
  DataCacheElement *oldValue;
  UHashtable *htable;
  char *pcStack_38;
  int32_t nameLen;
  char *baseName;
  DataCacheElement *newElement;
  UErrorCode *pErr_local;
  UDataMemory *item_local;
  char *path_local;
  
  pvStack_50 = (void *)0x0;
  local_54 = U_ZERO_ERROR;
  newElement = (DataCacheElement *)pErr;
  pErr_local = (UErrorCode *)item;
  item_local = (UDataMemory *)path;
  oldValue = (DataCacheElement *)udata_getHashTable(pErr);
  UVar1 = U_FAILURE(*(UErrorCode *)&newElement->name);
  if (UVar1 == '\0') {
    baseName = (char *)uprv_malloc_63(0x10);
    if (baseName == (char *)0x0) {
      *(undefined4 *)&newElement->name = 7;
      path_local = (char *)0x0;
    }
    else {
      pUVar2 = UDataMemory_createNewInstance_63((UErrorCode *)newElement);
      *(UDataMemory **)(baseName + 8) = pUVar2;
      UVar1 = U_FAILURE(*(UErrorCode *)&newElement->name);
      if (UVar1 == '\0') {
        UDatamemory_assign_63(*(UDataMemory **)(baseName + 8),(UDataMemory *)pErr_local);
        pcStack_38 = findBasename((char *)item_local);
        sVar3 = strlen(pcStack_38);
        htable._4_4_ = (int)sVar3;
        pvVar4 = uprv_malloc_63((long)(htable._4_4_ + 1));
        *(void **)baseName = pvVar4;
        if (*(long *)baseName == 0) {
          *(undefined4 *)&newElement->name = 7;
          uprv_free_63(*(void **)(baseName + 8));
          uprv_free_63(baseName);
          path_local = (char *)0x0;
        }
        else {
          strcpy(*(char **)baseName,pcStack_38);
          umtx_lock_63((UMutex *)0x0);
          pvStack_50 = uhash_get_63((UHashtable *)oldValue,item_local);
          if (pvStack_50 == (void *)0x0) {
            uhash_put_63((UHashtable *)oldValue,*(void **)baseName,baseName,&local_54);
          }
          else {
            local_54 = U_USING_DEFAULT_WARNING;
          }
          umtx_unlock_63((UMutex *)0x0);
          if ((local_54 != U_USING_DEFAULT_WARNING) && (UVar1 = U_FAILURE(local_54), UVar1 == '\0'))
          {
            return *(UDataMemory **)(baseName + 8);
          }
          *(UErrorCode *)&newElement->name = local_54;
          uprv_free_63(*(void **)baseName);
          uprv_free_63(*(void **)(baseName + 8));
          uprv_free_63(baseName);
          if (pvStack_50 == (void *)0x0) {
            local_60 = (char *)0x0;
          }
          else {
            local_60 = *(char **)((long)pvStack_50 + 8);
          }
          path_local = local_60;
        }
      }
      else {
        uprv_free_63(baseName);
        path_local = (char *)0x0;
      }
    }
  }
  else {
    path_local = (char *)0x0;
  }
  return (UDataMemory *)path_local;
}

Assistant:

static UDataMemory *udata_cacheDataItem(const char *path, UDataMemory *item, UErrorCode *pErr) {
    DataCacheElement *newElement;
    const char       *baseName;
    int32_t           nameLen;
    UHashtable       *htable;
    DataCacheElement *oldValue = NULL;
    UErrorCode        subErr = U_ZERO_ERROR;

    htable = udata_getHashTable(*pErr);
    if (U_FAILURE(*pErr)) {
        return NULL;
    }

    /* Create a new DataCacheElement - the thingy we store in the hash table -
     * and copy the supplied path and UDataMemoryItems into it.
     */
    newElement = (DataCacheElement *)uprv_malloc(sizeof(DataCacheElement));
    if (newElement == NULL) {
        *pErr = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    newElement->item = UDataMemory_createNewInstance(pErr);
    if (U_FAILURE(*pErr)) {
        uprv_free(newElement);
        return NULL;
    }
    UDatamemory_assign(newElement->item, item);

    baseName = findBasename(path);
    nameLen = (int32_t)uprv_strlen(baseName);
    newElement->name = (char *)uprv_malloc(nameLen+1);
    if (newElement->name == NULL) {
        *pErr = U_MEMORY_ALLOCATION_ERROR;
        uprv_free(newElement->item);
        uprv_free(newElement);
        return NULL;
    }
    uprv_strcpy(newElement->name, baseName);

    /* Stick the new DataCacheElement into the hash table.
    */
    umtx_lock(NULL);
    oldValue = (DataCacheElement *)uhash_get(htable, path);
    if (oldValue != NULL) {
        subErr = U_USING_DEFAULT_WARNING;
    }
    else {
        uhash_put(
            htable,
            newElement->name,               /* Key   */
            newElement,                     /* Value */
            &subErr);
    }
    umtx_unlock(NULL);

#ifdef UDATA_DEBUG
    fprintf(stderr, "Cache: [%s] <<< %p : %s. vFunc=%p\n", newElement->name, 
    newElement->item, u_errorName(subErr), newElement->item->vFuncs);
#endif

    if (subErr == U_USING_DEFAULT_WARNING || U_FAILURE(subErr)) {
        *pErr = subErr; /* copy sub err unto fillin ONLY if something happens. */
        uprv_free(newElement->name);
        uprv_free(newElement->item);
        uprv_free(newElement);
        return oldValue ? oldValue->item : NULL;
    }

    return newElement->item;
}